

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  size_type local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __n = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                  (str,(replaceThis->_M_dataplus)._M_p,0,replaceThis->_M_string_length);
  local_78 = __n;
  if (__n != 0xffffffffffffffff) {
    paVar1 = &local_98.field_2;
    do {
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_50,str,0,__n);
      pbVar2 = clara::std::__cxx11::
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                         (&local_50,(withThis->_M_dataplus)._M_p,withThis->_M_string_length);
      local_98._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
      paVar3 = &pbVar2->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == paVar3) {
        local_98.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      }
      local_98._M_string_length = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_70,str,replaceThis->_M_string_length + __n,0xffffffffffffffff);
      uVar4 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        uVar4 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar4 < local_70._M_string_length + local_98._M_string_length) {
        uVar4 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          uVar4 = local_70.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar4 < local_70._M_string_length + local_98._M_string_length) goto LAB_00125c68;
        pbVar2 = clara::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                           (&local_70,0,0,local_98._M_dataplus._M_p,local_98._M_string_length);
      }
      else {
LAB_00125c68:
        pbVar2 = clara::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                           (&local_98,local_70._M_dataplus._M_p,local_70._M_string_length);
      }
      local_b8._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
      paVar3 = &pbVar2->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == paVar3) {
        local_b8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      }
      local_b8._M_string_length = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
      pbVar2->_M_string_length = 0;
      paVar3->_M_local_buf[0] = '\0';
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(str,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (str->_M_string_length - withThis->_M_string_length <= __n) break;
      __n = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find(str,(replaceThis->_M_dataplus)._M_p,withThis->_M_string_length + __n,
                 replaceThis->_M_string_length);
    } while (__n != 0xffffffffffffffff);
  }
  return local_78 != 0xffffffffffffffff;
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        bool replaced = false;
        std::size_t i = str.find( replaceThis );
        while( i != std::string::npos ) {
            replaced = true;
            str = str.substr( 0, i ) + withThis + str.substr( i+replaceThis.size() );
            if( i < str.size()-withThis.size() )
                i = str.find( replaceThis, i+withThis.size() );
            else
                i = std::string::npos;
        }
        return replaced;
    }